

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

int compress_deflate(Byte *out,uint *outlen,Byte *in,uint inlen)

{
  int iVar1;
  Byte *pBStack_a0;
  int err;
  z_stream stream;
  uint inlen_local;
  Byte *in_local;
  uint *outlen_local;
  Byte *out_local;
  
  stream.next_out._0_4_ = *outlen;
  stream.state = (internal_state *)0x0;
  stream.zalloc = (alloc_func)0x0;
  stream.zfree = (free_func)0x0;
  pBStack_a0 = in;
  stream.next_in._0_4_ = inlen;
  stream.total_in = (uLong)out;
  stream.reserved._4_4_ = inlen;
  iVar1 = deflateInit2_(&stack0xffffffffffffff60,9,8,0xfffffff1,9,0,"1.2.11",0x70);
  if (iVar1 == 0) {
    iVar1 = deflate(&stack0xffffffffffffff60,4);
    if (iVar1 == 1) {
      *outlen = stream.avail_out;
      iVar1 = deflateEnd(&stack0xffffffffffffff60);
      out_local._4_4_ = -1;
      if (iVar1 == 0) {
        out_local._4_4_ = 0;
      }
    }
    else {
      deflateEnd(&stack0xffffffffffffff60);
      out_local._4_4_ = -1;
    }
  }
  else {
    out_local._4_4_ = -1;
  }
  return out_local._4_4_;
}

Assistant:

int compress_deflate(Byte *out, unsigned int *outlen, const Byte *in, unsigned int inlen)
{
    z_stream stream;
    int err;

    stream.next_in = (Bytef *)in;
    stream.avail_in = inlen;
    stream.next_out = out;
    stream.avail_out = *outlen;
    stream.zalloc = (alloc_func)0;
    stream.zfree = (free_func)0;
    stream.opaque = (voidpf)0;

    err = deflateInit2(&stream, 9, Z_DEFLATED, -15, 9, Z_DEFAULT_STRATEGY);
    if (err != Z_OK) return -1;

    err = deflate(&stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        deflateEnd(&stream);
        return -1;
    }
    *outlen = stream.total_out;

    err = deflateEnd(&stream);
	return err == Z_OK ? 0 : -1;
}